

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRBlock * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::allocate<>
          (ObjectPool<spirv_cross::SPIRBlock> *this)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> _Var3;
  uint uVar4;
  ulong uVar5;
  SPIRBlock *__s;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size == 0) {
    uVar4 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>)malloc((ulong)uVar4 * 0x2e8);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl !=
        (SPIRBlock *)0x0) {
      if (uVar4 != 0) {
        uVar5 = (ulong)uVar4;
        _Var3._M_head_impl =
             (SPIRBlock *)_Var2.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRBlock_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar1] = _Var3._M_head_impl
          ;
          (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = sVar1 + 1;
          _Var3._M_head_impl = _Var3._M_head_impl + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl !=
          (SPIRBlock *)0x0) goto LAB_002cf7ab;
    }
    __s = (SPIRBlock *)0x0;
  }
  else {
LAB_002cf7ab:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
    __s = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRBlock_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    memset(__s,0,0x2e8);
    (__s->super_IVariant).self.id = 0;
    (__s->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRBlock_0035c9d0;
    __s->true_block = 0;
    __s->false_block = 0;
    *(undefined8 *)&__s->default_block = 0;
    *(undefined8 *)((long)&(__s->ops).super_VectorView<spirv_cross::Instruction>.ptr + 4) = 0;
    *(undefined8 *)((long)&(__s->ops).super_VectorView<spirv_cross::Instruction>.buffer_size + 4) =
         0;
    *(undefined4 *)((long)&(__s->ops).buffer_capacity + 4) = 0;
    *(undefined8 *)&(__s->super_IVariant).field_0xc = 0;
    __s->hint = HintNone;
    __s->next_block = 0;
    __s->merge_block = 0;
    __s->continue_block = 0;
    __s->return_value = 0;
    __s->condition = 0;
    (__s->ops).super_VectorView<spirv_cross::Instruction>.ptr =
         (Instruction *)&(__s->ops).stack_storage;
    (__s->ops).buffer_capacity = 8;
    (__s->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr = (Phi *)0x0;
    (__s->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size = 0;
    (__s->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr =
         (Phi *)&(__s->phi_variables).stack_storage;
    (__s->phi_variables).buffer_capacity = 8;
    (__s->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)0x0;
    (__s->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .buffer_size = 0;
    (__s->declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)&(__s->declare_temporary).stack_storage;
    (__s->declare_temporary).buffer_capacity = 8;
    (__s->potential_declare_temporary).buffer_capacity = 0;
    (__s->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)0x0;
    (__s->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .buffer_size = 0;
    (__s->potential_declare_temporary).
    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
    .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
            *)&(__s->potential_declare_temporary).stack_storage;
    (__s->potential_declare_temporary).buffer_capacity = 8;
    (__s->cases).buffer_capacity = 0;
    (__s->cases).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr = (Case *)0x0;
    (__s->cases).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size = 0;
    (__s->cases).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
         (Case *)&(__s->cases).stack_storage;
    (__s->cases).buffer_capacity = 8;
    __s->disable_block_optimization = false;
    __s->complex_continue = false;
    __s->need_ladder_break = false;
    __s->ignore_phi_from_block = 0;
    __s->loop_dominator = 0;
    (__s->dominated_variables).buffer_capacity = 0;
    (__s->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)0x0;
    (__s->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = 0;
    (__s->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)&(__s->dominated_variables).stack_storage;
    (__s->dominated_variables).buffer_capacity = 8;
    (__s->loop_variables).buffer_capacity = 0;
    (__s->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)0x0;
    (__s->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size
         = 0;
    (__s->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)&(__s->loop_variables).stack_storage;
    (__s->loop_variables).buffer_capacity = 8;
    (__s->invalidate_expressions).buffer_capacity = 0;
    (__s->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
         = (TypedID<(spirv_cross::Types)0> *)0x0;
    (__s->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    buffer_size = 0;
    (__s->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
         = (TypedID<(spirv_cross::Types)0> *)&(__s->invalidate_expressions).stack_storage;
    (__s->invalidate_expressions).buffer_capacity = 8;
  }
  return __s;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}